

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O3

parse_result * __thiscall
ocmesh::details::scene::parse(parse_result *__return_storage_ptr__,scene *this,istream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  parse_result r;
  parser local_c0;
  
  paVar1 = &local_c0._current._text.field_2;
  local_c0._current._kind = unknown;
  local_c0._current._text._M_string_length = 0;
  local_c0._current._text.field_2._M_local_buf[0] = '\0';
  local_c0._current._value = 0.0;
  local_c0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._materials._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._materials._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0._materials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._materials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._materials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._last_material = 1;
  local_c0._scene = this;
  local_c0._stream = stream;
  local_c0._current._text._M_dataplus._M_p = (pointer)paVar1;
  local_c0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._materials._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._materials._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  parser::parse(&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_c0._materials._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ocmesh::details::object_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ocmesh::details::object_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ocmesh::details::object_*>_>_>
  ::~_Rb_tree(&local_c0._bindings._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._current._text._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._current._text._M_dataplus._M_p,
                    CONCAT71(local_c0._current._text.field_2._M_allocated_capacity._1_7_,
                             local_c0._current._text.field_2._M_local_buf[0]) + 1);
  }
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->_error)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->_error)._M_string_length = 0;
  (__return_storage_ptr__->_error).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->_error).field_2 + 8) = 0;
  __return_storage_ptr__->_ok = true;
  (__return_storage_ptr__->_error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_error).field_2;
  (__return_storage_ptr__->_error).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

scene::parse_result scene::parse(std::istream &stream)
    {
        try {
            parser(this, stream).parse();
        } catch(scene::parse_result r) {
            return r;
        }
        
        return { };
    }